

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffReporter.cpp
# Opt level: O2

void __thiscall ApprovalTests::DiffReporter::DiffReporter(DiffReporter *this)

{
  EnvironmentVariableReporter *this_00;
  MacDiffReporter *this_01;
  LinuxDiffReporter *this_02;
  WindowsDiffReporter *this_03;
  CrossPlatformDiffReporter *this_04;
  initializer_list<ApprovalTests::Reporter_*> __l;
  allocator_type local_51;
  _Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> local_50;
  EnvironmentVariableReporter *local_38;
  MacDiffReporter *local_30;
  LinuxDiffReporter *local_28;
  WindowsDiffReporter *local_20;
  CrossPlatformDiffReporter *local_18;
  
  this_00 = (EnvironmentVariableReporter *)operator_new(0x38);
  (this_00->super_Reporter)._vptr_Reporter = (_func_int **)0x0;
  *(undefined8 *)&(this_00->factory).map._M_t._M_impl = 0;
  *(undefined8 *)&(this_00->factory).map._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this_00->factory).map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->factory).map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this_00->factory).map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this_00->factory).map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  EnvironmentVariableReporter::EnvironmentVariableReporter(this_00);
  local_38 = this_00;
  this_01 = (MacDiffReporter *)operator_new(0x20);
  Mac::MacDiffReporter::MacDiffReporter(this_01);
  local_30 = this_01;
  this_02 = (LinuxDiffReporter *)operator_new(0x20);
  Linux::LinuxDiffReporter::LinuxDiffReporter(this_02);
  local_28 = this_02;
  this_03 = (WindowsDiffReporter *)operator_new(0x20);
  Windows::WindowsDiffReporter::WindowsDiffReporter(this_03);
  local_20 = this_03;
  this_04 = (CrossPlatformDiffReporter *)operator_new(0x20);
  CrossPlatform::CrossPlatformDiffReporter::CrossPlatformDiffReporter(this_04);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_38;
  local_18 = this_04;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            ((vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
             &local_50,__l,&local_51);
  FirstWorkingReporter::FirstWorkingReporter
            (&this->super_FirstWorkingReporter,
             (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
             &local_50);
  ::std::_Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::
  ~_Vector_base(&local_50);
  (this->super_FirstWorkingReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__FirstWorkingReporter_0013d770;
  return;
}

Assistant:

DiffReporter::DiffReporter()
        : FirstWorkingReporter({new EnvironmentVariableReporter(),
                                new Mac::MacDiffReporter(),
                                new Linux::LinuxDiffReporter(),
                                new Windows::WindowsDiffReporter(),
                                new CrossPlatform::CrossPlatformDiffReporter()})
    {
    }